

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O2

int run_test_timer_init(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  uint64_t uVar3;
  undefined8 uVar4;
  char *pcVar5;
  uv_timer_t handle;
  uv_timer_t uStack_98;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_timer_init(puVar2,&uStack_98);
  if (iVar1 == 0) {
    uVar3 = uv_timer_get_repeat(&uStack_98);
    if (uVar3 == 0) {
      iVar1 = uv_is_active((uv_handle_t *)&uStack_98);
      if (iVar1 == 0) {
        puVar2 = uv_default_loop();
        close_loop(puVar2);
        puVar2 = uv_default_loop();
        iVar1 = uv_loop_close(puVar2);
        if (iVar1 == 0) {
          return 0;
        }
        pcVar5 = "0 == uv_loop_close(uv_default_loop())";
        uVar4 = 0xa6;
      }
      else {
        pcVar5 = "0 == uv_is_active((uv_handle_t*) &handle)";
        uVar4 = 0xa4;
      }
    }
    else {
      pcVar5 = "0 == uv_timer_get_repeat(&handle)";
      uVar4 = 0xa3;
    }
  }
  else {
    pcVar5 = "0 == uv_timer_init(uv_default_loop(), &handle)";
    uVar4 = 0xa2;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
          ,uVar4,pcVar5);
  abort();
}

Assistant:

TEST_IMPL(timer_init) {
  uv_timer_t handle;

  ASSERT(0 == uv_timer_init(uv_default_loop(), &handle));
  ASSERT(0 == uv_timer_get_repeat(&handle));
  ASSERT(0 == uv_is_active((uv_handle_t*) &handle));

  MAKE_VALGRIND_HAPPY();
  return 0;
}